

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O0

bool google::protobuf::compiler::annotation_test_util::DecodeMetadata
               (string *path,GeneratedCodeInfo *info)

{
  bool bVar1;
  int size;
  char *failure_msg;
  LogMessage *pLVar2;
  void *data_00;
  Status *local_b0;
  undefined1 local_98 [8];
  ArrayInputStream input;
  Voidify local_61;
  undefined1 local_60 [32];
  pair<const_absl::lts_20250127::Status_*,_const_char_*> absl_log_internal_check_ok_goo;
  string data;
  GeneratedCodeInfo *info_local;
  string *path_local;
  
  std::__cxx11::string::string((string *)&absl_log_internal_check_ok_goo.second);
  std::pair<const_absl::lts_20250127::Status_*,_const_char_*>::
  pair<const_absl::lts_20250127::Status_*,_const_char_*,_true>
            ((pair<const_absl::lts_20250127::Status_*,_const_char_*> *)(local_60 + 0x18));
  File::GetContents((string *)local_60,path,(bool)((char)&absl_log_internal_check_ok_goo + '\b'));
  local_60._24_8_ = absl::lts_20250127::log_internal::AsStatus((Status *)local_60);
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_60._24_8_);
  if (bVar1) {
    local_b0 = (Status *)0x0;
  }
  else {
    local_b0 = (Status *)
               absl::lts_20250127::status_internal::MakeCheckFailString
                         ((Nonnull<const_absl::Status_*>)local_60._24_8_,
                          "File::GetContents(path, &data, true) is OK");
  }
  absl_log_internal_check_ok_goo.first = local_b0;
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_60._24_8_);
  absl::lts_20250127::Status::~Status((Status *)local_60);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    data_00 = (void *)std::__cxx11::string::data();
    size = std::__cxx11::string::size();
    io::ArrayInputStream::ArrayInputStream((ArrayInputStream *)local_98,data_00,size,-1);
    bVar1 = MessageLite::ParseFromZeroCopyStream
                      ((MessageLite *)info,(ZeroCopyInputStream *)local_98);
    io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)local_98);
    std::__cxx11::string::~string((string *)&absl_log_internal_check_ok_goo.second);
    return bVar1;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>
                          ((type_identity_t<const_char_*>)absl_log_internal_check_ok_goo.first);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&input.position_,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/annotation_test_util.cc"
             ,0x4c,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                     ((LogMessage *)&input.position_);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
            ((LogMessageFatal *)&input.position_);
}

Assistant:

bool DecodeMetadata(const std::string& path, GeneratedCodeInfo* info) {
  std::string data;
  ABSL_CHECK_OK(File::GetContents(path, &data, true));
  io::ArrayInputStream input(data.data(), data.size());
  return info->ParseFromZeroCopyStream(&input);
}